

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Vector<float,_3> __thiscall tcu::operator*(tcu *this,Vector<float,_2> *vec,Matrix<float,_2,_3> *mtx)

{
  int col;
  long lVar1;
  int row;
  long lVar2;
  float v;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  float in_XMM1_Da;
  Vector<float,_3> VVar4;
  
  Vector<float,_3>::Vector((Vector<float,_3> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    uVar3 = 0;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      in_XMM1_Da = ((Vector<tcu::Vector<float,_2>,_3> *)((Vector<float,_2> *)mtx)->m_data)->m_data
                   [0].m_data[lVar2] * vec->m_data[lVar2];
      uVar3 = (ulong)(uint)((float)uVar3 + in_XMM1_Da);
    }
    *(float *)(this + lVar1 * 4) = (float)uVar3;
    mtx = (Matrix<float,_2,_3> *)((long)mtx + 8);
  }
  VVar4.m_data[2] = in_XMM1_Da;
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_3>)VVar4.m_data;
}

Assistant:

Vector<T, Cols> operator* (const Vector<T, Rows>& vec, const Matrix<T, Rows, Cols>& mtx)
{
	Vector<T, Cols> res;
	for (int col = 0; col < Cols; col++)
	{
		T v = T(0);
		for (int row = 0; row < Rows; row++)
			v += mtx(row,col) * vec.m_data[row];
		res.m_data[col] = v;
	}
	return res;
}